

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concavity.cpp
# Opt level: O3

float __thiscall
ConvexDecomposition::CTri::raySect(CTri *this,Vector3d *p,Vector3d *dir,Vector3d *sect)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  fVar1 = (this->mNormal).y;
  fVar2 = p->y;
  fVar3 = p->x;
  fVar4 = p->z;
  fVar5 = this->mPlaneD;
  auVar7 = ZEXT416((uint)(this->mNormal).x);
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar1)),ZEXT416((uint)fVar3),auVar7);
  fVar2 = (fVar2 + dir->y * 100000.0) - fVar2;
  auVar9 = ZEXT416((uint)(this->mNormal).z);
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar4),auVar9);
  auVar11 = ZEXT416((uint)((dir->x * 100000.0 + fVar3) - fVar3));
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar2)),auVar11,auVar7);
  auVar10 = ZEXT416((uint)((fVar4 + dir->z * 100000.0) - fVar4));
  auVar7 = vfmadd231ss_fma(auVar7,auVar10,auVar9);
  auVar9._8_4_ = 0x80000000;
  auVar9._0_8_ = 0x8000000080000000;
  auVar9._12_4_ = 0x80000000;
  auVar6 = vxorps_avx512vl(ZEXT416((uint)(fVar5 + ((auVar6._0_4_ + fVar5) - fVar5))),auVar9);
  auVar8._0_4_ = auVar6._0_4_ / auVar7._0_4_;
  auVar8._4_12_ = auVar6._4_12_;
  auVar6 = vfmadd213ss_fma(auVar11,auVar8,ZEXT416((uint)fVar3));
  sect->x = auVar6._0_4_;
  auVar7 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar8,ZEXT416((uint)p->y));
  sect->y = auVar7._0_4_;
  auVar9 = vfmadd213ss_fma(auVar8,auVar10,ZEXT416((uint)p->z));
  sect->z = auVar9._0_4_;
  fVar1 = p->y - auVar7._0_4_;
  auVar6 = ZEXT416((uint)(p->x - auVar6._0_4_));
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar6,auVar6);
  auVar7 = ZEXT416((uint)(p->z - auVar9._0_4_));
  auVar6 = vfmadd231ss_fma(auVar6,auVar7,auVar7);
  auVar6 = vsqrtss_avx(auVar6,auVar6);
  return auVar6._0_4_;
}

Assistant:

float raySect(const Vector3d &p,const Vector3d &dir,Vector3d &sect) const
	{
		float plane[4];

    plane[0] = mNormal.x;
    plane[1] = mNormal.y;
    plane[2] = mNormal.z;
    plane[3] = mPlaneD;

		Vector3d dest = p+dir*100000;

    intersect( p.Ptr(), dest.Ptr(), sect.Ptr(), plane );

    return sect.Distance(p); // return the intersection distance.

	}